

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_ManRemapBarbufs(Bac_Man_t *pNew,Bac_Man_t *p)

{
  int iVar1;
  int iVar2;
  Bac_Ntk_t *pBVar3;
  int local_28;
  int i;
  int Entry;
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p_local;
  Bac_Man_t *pNew_local;
  
  iVar1 = Vec_IntSize(&pNew->vBuf2RootNtk);
  if (iVar1 != 0) {
    __assert_fail("!Vec_IntSize(&pNew->vBuf2RootNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x131,"void Bac_ManRemapBarbufs(Bac_Man_t *, Bac_Man_t *)");
  }
  Vec_IntAppend(&pNew->vBuf2RootNtk,&p->vBuf2RootNtk);
  Vec_IntAppend(&pNew->vBuf2RootObj,&p->vBuf2RootObj);
  Vec_IntAppend(&pNew->vBuf2LeafNtk,&p->vBuf2LeafNtk);
  Vec_IntAppend(&pNew->vBuf2LeafObj,&p->vBuf2LeafObj);
  for (local_28 = 0; iVar1 = Vec_IntSize(&p->vBuf2LeafObj), local_28 < iVar1;
      local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(&p->vBuf2LeafObj,local_28);
    iVar2 = Vec_IntEntry(&p->vBuf2LeafNtk,local_28);
    pBVar3 = Bac_ManNtk(p,iVar2);
    iVar1 = Bac_ObjCopy(pBVar3,iVar1);
    Vec_IntWriteEntry(&pNew->vBuf2LeafObj,local_28,iVar1);
  }
  for (local_28 = 0; iVar1 = Vec_IntSize(&p->vBuf2RootObj), local_28 < iVar1;
      local_28 = local_28 + 1) {
    iVar1 = Vec_IntEntry(&p->vBuf2RootObj,local_28);
    iVar2 = Vec_IntEntry(&p->vBuf2RootNtk,local_28);
    pBVar3 = Bac_ManNtk(p,iVar2);
    iVar1 = Bac_ObjCopy(pBVar3,iVar1);
    Vec_IntWriteEntry(&pNew->vBuf2RootObj,local_28,iVar1);
  }
  return;
}

Assistant:

void Bac_ManRemapBarbufs( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk;  int Entry, i;
    //assert( Vec_IntSize(&p->vBuf2RootNtk) );
    assert( !Vec_IntSize(&pNew->vBuf2RootNtk) );
    Vec_IntAppend( &pNew->vBuf2RootNtk, &p->vBuf2RootNtk );
    Vec_IntAppend( &pNew->vBuf2RootObj, &p->vBuf2RootObj );
    Vec_IntAppend( &pNew->vBuf2LeafNtk, &p->vBuf2LeafNtk );
    Vec_IntAppend( &pNew->vBuf2LeafObj, &p->vBuf2LeafObj );
    Vec_IntForEachEntry( &p->vBuf2LeafObj, Entry, i )
    {
        pNtk = Bac_ManNtk( p, Vec_IntEntry(&p->vBuf2LeafNtk, i) );
        Vec_IntWriteEntry( &pNew->vBuf2LeafObj, i, Bac_ObjCopy(pNtk, Entry) );
    }
    Vec_IntForEachEntry( &p->vBuf2RootObj, Entry, i )
    {
        pNtk = Bac_ManNtk( p, Vec_IntEntry(&p->vBuf2RootNtk, i) );
        Vec_IntWriteEntry( &pNew->vBuf2RootObj, i, Bac_ObjCopy(pNtk, Entry) );
    }
}